

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QPluginParsedMetaData>::reallocateAndGrow
          (QArrayDataPointer<QPluginParsedMetaData> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QPluginParsedMetaData> *old)

{
  long lVar1;
  bool bVar2;
  QPluginParsedMetaData *pQVar3;
  QGenericArrayOps<QPluginParsedMetaData> *this_00;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QPluginParsedMetaData> dp;
  QArrayDataPointer<QPluginParsedMetaData> *in_stack_ffffffffffffff78;
  QArrayDataPointer<QPluginParsedMetaData> *in_stack_ffffffffffffff80;
  QPluginParsedMetaData *in_stack_ffffffffffffff88;
  QGenericArrayOps<QPluginParsedMetaData> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  allocateGrow((QArrayDataPointer<QPluginParsedMetaData> *)&DAT_aaaaaaaaaaaaaaaa,-0x5555555555555556
               ,0xaaaaaaaa);
  if ((in_RDX < 1) ||
     (pQVar3 = data((QArrayDataPointer<QPluginParsedMetaData> *)&stack0xffffffffffffffe0),
     pQVar3 != (QPluginParsedMetaData *)0x0)) {
    if (*(long *)(in_RDI + 0x10) != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QPluginParsedMetaData> *)
                  operator->((QArrayDataPointer<QPluginParsedMetaData> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QPluginParsedMetaData> *)0x455ec1);
        begin((QArrayDataPointer<QPluginParsedMetaData> *)0x455ed0);
        QtPrivate::QGenericArrayOps<QPluginParsedMetaData>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,
                   (QPluginParsedMetaData *)in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QArrayDataPointer<QPluginParsedMetaData> *)
             operator->((QArrayDataPointer<QPluginParsedMetaData> *)&stack0xffffffffffffffe0);
        pQVar3 = begin((QArrayDataPointer<QPluginParsedMetaData> *)0x455f09);
        begin((QArrayDataPointer<QPluginParsedMetaData> *)0x455f18);
        QtPrivate::QGenericArrayOps<QPluginParsedMetaData>::moveAppend
                  (in_stack_ffffffffffffff90,pQVar3,
                   (QPluginParsedMetaData *)in_stack_ffffffffffffff80);
      }
    }
    swap(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff80);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    qBadAlloc();
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }